

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O3

void __thiscall QDBusMenuBar::registerMenuBar(QDBusMenuBar *this)

{
  QDBusMenuBar *pQVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  int *piVar5;
  char cVar6;
  int iVar7;
  WId WVar8;
  undefined4 extraout_var;
  long *plVar9;
  undefined8 uVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QLatin1String QVar14;
  QDBusPendingReply<> r;
  QDBusConnection connection;
  QDBusError local_168;
  QArrayData *local_128;
  QArrayData *local_110;
  undefined8 *local_108;
  QDBusError local_f8;
  QArrayData *local_b8;
  QArrayData *local_a0;
  undefined8 *local_98;
  QString local_88;
  char *local_70;
  QDBusPendingReplyBase local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  local_168._0_8_ = (QArrayData *)0x0;
  local_168.msg.d.d = (Data *)0x6ca066;
  local_168.msg.d.ptr = (char16_t *)0xb;
  registerMenuBar::menuBarId = registerMenuBar::menuBarId + 1;
  QString::arg_impl((ulonglong)&local_f8,(int)&local_168,registerMenuBar::menuBarId,(QChar)0x0);
  pQVar2 = *(QArrayData **)(this + 0x38);
  pDVar3 = *(Data **)(this + 0x40);
  *(ErrorType *)(this + 0x38) = local_f8.code;
  *(undefined4 *)(this + 0x3c) = local_f8._4_4_;
  *(undefined4 *)(this + 0x40) = local_f8.msg.d.d._0_4_;
  *(undefined4 *)(this + 0x44) = local_f8.msg.d.d._4_4_;
  pcVar4 = *(char16_t **)(this + 0x48);
  *(char16_t **)(this + 0x48) = local_f8.msg.d.ptr;
  local_f8._0_8_ = pQVar2;
  local_f8.msg.d.d = pDVar3;
  local_f8.msg.d.ptr = pcVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  pQVar1 = this + 0x38;
  if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
    }
  }
  cVar6 = QDBusConnection::registerObject(&local_40,pQVar1,*(undefined8 *)(this + 0x10),1);
  if (cVar6 != '\0') {
    QGuiApplication::platformName();
    if (local_f8.msg.d.ptr == (char16_t *)0x3) {
      QVar11.m_data = (storage_type_conflict *)local_f8.msg.d.d;
      QVar11.m_size = 3;
      QVar14.m_data = "xcb";
      QVar14.m_size = 3;
      cVar6 = QtPrivate::equalStrings(QVar11,QVar14);
    }
    else {
      cVar6 = '\0';
    }
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
    if (cVar6 != '\0') {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QVar12.m_data = (storage_type *)0x1f;
      QVar12.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar12);
      local_168.code = local_f8.code;
      local_168._4_4_ = local_f8._4_4_;
      local_168.msg.d.d = local_f8.msg.d.d;
      local_168.msg.d.ptr = local_f8.msg.d.ptr;
      QVar13.m_data = (storage_type *)0x20;
      QVar13.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar13);
      local_88.d.d._0_4_ = local_f8.code;
      local_88.d.d._4_4_ = local_f8._4_4_;
      local_88.d.ptr._0_4_ = SUB84(local_f8.msg.d.d,0);
      local_88.d.ptr._4_4_ = (undefined4)((ulong)local_f8.msg.d.d >> 0x20);
      local_88.d.size._0_4_ = SUB84(local_f8.msg.d.ptr,0);
      local_88.d.size._4_4_ = (undefined4)((ulong)local_f8.msg.d.ptr >> 0x20);
      QDBusMenuRegistrarInterface::QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58,(QString *)&local_168,&local_88,
                 (QDBusConnection *)&local_40,(QObject *)this);
      piVar5 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
        }
      }
      if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
        }
      }
      local_60 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
      WVar8 = QWindow::winId(*(QWindow **)(this + 0x30));
      local_f8._0_8_ = *(undefined8 *)(this + 0x38);
      local_f8.msg.d.d = *(Data **)(this + 0x40);
      local_f8.msg.d.ptr = *(char16_t **)(this + 0x48);
      if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_f8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_f8._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QDBusObjectPath::doCheck();
      QDBusMenuRegistrarInterface::RegisterWindow
                ((QDBusPendingReply<> *)&local_60,(QDBusMenuRegistrarInterface *)&local_58,
                 (uint)WVar8,(QDBusObjectPath *)&local_f8);
      if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
        }
      }
      QDBusPendingCall::waitForFinished();
      cVar6 = QDBusPendingCall::isError();
      if (cVar6 != '\0') {
        local_88.d.d._0_4_ = 2;
        local_88.d.d._4_4_ = 0;
        local_88.d.ptr._0_4_ = 0;
        local_88.d.ptr._4_4_ = 0;
        local_88.d.size._0_4_ = 0;
        local_88.d.size._4_4_ = 0;
        local_70 = "default";
        QDBusPendingCall::error();
        QDBusError::name();
        QString::toUtf8_helper((QString *)&local_a0);
        if (local_98 == (undefined8 *)0x0) {
          local_98 = &QByteArray::_empty;
        }
        QDBusPendingCall::error();
        QDBusError::message();
        QString::toUtf8_helper((QString *)&local_110);
        if (local_108 == (undefined8 *)0x0) {
          local_108 = &QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)&local_88,"Failed to register window menu, reason: %s (\"%s\")",local_98,
                   local_108);
        if (local_110 != (QArrayData *)0x0) {
          LOCK();
          (local_110->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_110->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_110->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_110,1,0x10);
          }
        }
        if (local_128 != (QArrayData *)0x0) {
          LOCK();
          (local_128->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_128->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_128->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_128,2,0x10);
          }
        }
        QDBusError::~QDBusError(&local_168);
        if (local_a0 != (QArrayData *)0x0) {
          LOCK();
          (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0,1,0x10);
          }
        }
        if (local_b8 != (QArrayData *)0x0) {
          LOCK();
          (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_b8,2,0x10);
          }
        }
        QDBusError::~QDBusError(&local_f8);
        QDBusConnection::unregisterObject(&local_40,pQVar1,0);
        QDBusPendingReplyBase::~QDBusPendingReplyBase(&local_60);
        QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                  ((QDBusMenuRegistrarInterface *)&local_58);
        goto LAB_00632ce6;
      }
      QDBusPendingReplyBase::~QDBusPendingReplyBase(&local_60);
      QDBusMenuRegistrarInterface::~QDBusMenuRegistrarInterface
                ((QDBusMenuRegistrarInterface *)&local_58);
    }
    iVar7 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0x13])();
    if (CONCAT44(extraout_var,iVar7) == 0) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar7),&QPlatformServices::typeinfo,
                                      &QDesktopUnixServices::typeinfo,0);
    }
    if ((*(long *)(this + 0x28) == 0) || (*(int *)(*(long *)(this + 0x28) + 4) == 0)) {
      uVar10 = 0;
    }
    else {
      uVar10 = *(undefined8 *)(this + 0x30);
    }
    QDBusConnection::baseService();
    (**(code **)(*plVar9 + 0x40))(plVar9,uVar10,&local_f8,pQVar1);
    if ((QArrayData *)local_f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_f8._0_8_,2,0x10);
      }
    }
  }
LAB_00632ce6:
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::registerMenuBar()
{
    static uint menuBarId = 0;

    QDBusConnection connection = QDBusConnection::sessionBus();
    m_objectPath = QStringLiteral("/MenuBar/%1").arg(++menuBarId);
    if (!connection.registerObject(m_objectPath, m_menu))
        return;

    if (QGuiApplication::platformName() == "xcb"_L1) {
        QDBusMenuRegistrarInterface registrar(REGISTRAR_SERVICE, REGISTRAR_PATH, connection, this);
        QDBusPendingReply<> r = registrar.RegisterWindow(m_window->winId(), QDBusObjectPath(m_objectPath));
        r.waitForFinished();
        if (r.isError()) {
            qWarning("Failed to register window menu, reason: %s (\"%s\")",
                     qUtf8Printable(r.error().name()), qUtf8Printable(r.error().message()));
            connection.unregisterObject(m_objectPath);
            return;
        }
    }

    const auto unixServices = dynamic_cast<QDesktopUnixServices *>(
            QGuiApplicationPrivate::platformIntegration()->services());
    unixServices->registerDBusMenuForWindow(m_window, connection.baseService(), m_objectPath);
}